

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O1

void __thiscall
CGL::RaytracedRenderer::raytrace_tile
          (RaytracedRenderer *this,int tile_x,int tile_y,int tile_w,int tile_h)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar3 = (ulong)tile_x;
  uVar8 = (long)tile_w + uVar3;
  if (this->frame_w < (long)tile_w + uVar3) {
    uVar8 = this->frame_w;
  }
  uVar4 = (ulong)tile_y;
  uVar5 = (long)tile_h + uVar4;
  if (this->frame_h < (long)tile_h + uVar4) {
    uVar5 = this->frame_h;
  }
  uVar2 = this->imageTileSize;
  uVar6 = uVar4;
  if (uVar4 < uVar5) {
    do {
      if (this->continueRaytracing != true) {
        return;
      }
      uVar7 = uVar3;
      if (uVar3 < uVar8) {
        do {
          CGL::PathTracer::raytrace_pixel((ulong)this->pt,uVar7);
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar5);
  }
  piVar1 = (this->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + uVar3 / uVar2 + (uVar4 / uVar2) * this->num_tiles_w;
  *piVar1 = *piVar1 + 1;
  CGL::PathTracer::write_to_framebuffer
            ((ImageBuffer *)this->pt,(ulong)&this->frameBuffer,uVar3,uVar4,uVar8);
  return;
}

Assistant:

void RaytracedRenderer::raytrace_tile(int tile_x, int tile_y,
                               int tile_w, int tile_h) {
  size_t w = frame_w;
  size_t h = frame_h;

  size_t tile_start_x = tile_x;
  size_t tile_start_y = tile_y;

  size_t tile_end_x = std::min(tile_start_x + tile_w, w);
  size_t tile_end_y = std::min(tile_start_y + tile_h, h);

  size_t tile_idx_x = tile_x / imageTileSize;
  size_t tile_idx_y = tile_y / imageTileSize;
  size_t num_samples_tile = tile_samples[tile_idx_x + tile_idx_y * num_tiles_w];

  for (size_t y = tile_start_y; y < tile_end_y; y++) {
    if (!continueRaytracing) return;
    for (size_t x = tile_start_x; x < tile_end_x; x++) {
      pt->raytrace_pixel(x, y);
    }
  }

  tile_samples[tile_idx_x + tile_idx_y * num_tiles_w] += 1;

  pt->write_to_framebuffer(frameBuffer, tile_start_x, tile_start_y, tile_end_x, tile_end_y);
}